

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash3.h
# Opt level: O2

void MurmurHash3_x64_128(void *key,int len,uint32_t seed,void *out)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  uint8_t *data;
  ulong uVar3;
  long lVar4;
  
  uVar1 = ((ulong)(*key * -0x783c846eeebdac2b) >> 0x21 | *key * -0x775ed61580000000) *
          0x4cf5ad432745937f ^ 9;
  uVar2 = uVar1 + 9;
  uVar1 = uVar1 + 0x12;
  uVar2 = (uVar2 >> 0x21 ^ uVar2) * -0xae502812aa7333;
  uVar3 = (uVar2 >> 0x21 ^ uVar2) * -0x3b314601e57a13ad;
  uVar2 = (uVar1 >> 0x21 ^ uVar1) * -0xae502812aa7333;
  uVar2 = (uVar2 >> 0x21 ^ uVar2) * -0x3b314601e57a13ad;
  uVar2 = uVar2 >> 0x21 ^ uVar2;
  lVar4 = (uVar3 >> 0x21 ^ uVar3) + uVar2;
  *(long *)CONCAT44(in_register_00000034,len) = lVar4;
  *(ulong *)(CONCAT44(in_register_00000034,len) + 8) = uVar2 + lVar4;
  return;
}

Assistant:

static inline void MurmurHash3_x64_128(const void *key, const int len,
                                       const uint32_t seed, void *out) {
  const uint8_t *data = (const uint8_t *)key;
  const int nblocks = len / 16;

  uint64_t h1 = seed;
  uint64_t h2 = seed;

  const uint64_t c1 = BIG_CONSTANT(0x87c37b91114253d5);
  const uint64_t c2 = BIG_CONSTANT(0x4cf5ad432745937f);

  const uint64_t *blocks = (const uint64_t *)(data);

  for (int i = 0; i < nblocks; i++) {
    uint64_t k1 = getblock64(blocks, i * 2 + 0);
    uint64_t k2 = getblock64(blocks, i * 2 + 1);

    k1 *= c1;
    k1 = ROTL64(k1, 31);
    k1 *= c2;
    h1 ^= k1;

    h1 = ROTL64(h1, 27);
    h1 += h2;
    h1 = h1 * 5 + 0x52dce729;

    k2 *= c2;
    k2 = ROTL64(k2, 33);
    k2 *= c1;
    h2 ^= k2;

    h2 = ROTL64(h2, 31);
    h2 += h1;
    h2 = h2 * 5 + 0x38495ab5;
  }

  const uint8_t *tail = (const uint8_t *)(data + nblocks * 16);

  uint64_t k1 = 0;
  uint64_t k2 = 0;

  switch (len & 15) {
    case 15:
      k2 ^= ((uint64_t)tail[14]) << 48;
    case 14:
      k2 ^= ((uint64_t)tail[13]) << 40;
    case 13:
      k2 ^= ((uint64_t)tail[12]) << 32;
    case 12:
      k2 ^= ((uint64_t)tail[11]) << 24;
    case 11:
      k2 ^= ((uint64_t)tail[10]) << 16;
    case 10:
      k2 ^= ((uint64_t)tail[9]) << 8;
    case 9:
      k2 ^= ((uint64_t)tail[8]) << 0;
      k2 *= c2;
      k2 = ROTL64(k2, 33);
      k2 *= c1;
      h2 ^= k2;

    case 8:
      k1 ^= ((uint64_t)tail[7]) << 56;
    case 7:
      k1 ^= ((uint64_t)tail[6]) << 48;
    case 6:
      k1 ^= ((uint64_t)tail[5]) << 40;
    case 5:
      k1 ^= ((uint64_t)tail[4]) << 32;
    case 4:
      k1 ^= ((uint64_t)tail[3]) << 24;
    case 3:
      k1 ^= ((uint64_t)tail[2]) << 16;
    case 2:
      k1 ^= ((uint64_t)tail[1]) << 8;
    case 1:
      k1 ^= ((uint64_t)tail[0]) << 0;
      k1 *= c1;
      k1 = ROTL64(k1, 31);
      k1 *= c2;
      h1 ^= k1;
  };

  h1 ^= len;
  h2 ^= len;

  h1 += h2;
  h2 += h1;

  h1 = fmix64(h1);
  h2 = fmix64(h2);

  h1 += h2;
  h2 += h1;

  ((uint64_t *)out)[0] = h1;
  ((uint64_t *)out)[1] = h2;
}